

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Colour::Valid(Colour *this)

{
  uint64_t uVar1;
  uint64_t value;
  uint64_t uVar2;
  uint64_t value_00;
  bool bVar3;
  MasteringMetadata *in_RDI;
  
  if ((in_RDI[2].b_ != (PrimaryChromaticity *)0x0) &&
     (bVar3 = MasteringMetadata::Valid(in_RDI), !bVar3)) {
    return false;
  }
  uVar1._0_4_ = in_RDI->luminance_max_;
  uVar1._4_4_ = in_RDI->luminance_min_;
  if ((uVar1 != 0xffffffffffffffff) &&
     (value._0_4_ = in_RDI->luminance_max_, value._4_4_ = in_RDI->luminance_min_,
     bVar3 = IsMatrixCoefficientsValueValid(value), !bVar3)) {
    return false;
  }
  if ((in_RDI[1].r_ != (PrimaryChromaticity *)0xffffffffffffffff) &&
     (bVar3 = IsChromaSitingHorzValueValid((uint64_t)in_RDI[1].r_), !bVar3)) {
    return false;
  }
  if ((in_RDI[1].g_ != (PrimaryChromaticity *)0xffffffffffffffff) &&
     (bVar3 = IsChromaSitingVertValueValid((uint64_t)in_RDI[1].g_), !bVar3)) {
    return false;
  }
  if ((in_RDI[1].b_ != (PrimaryChromaticity *)0xffffffffffffffff) &&
     (bVar3 = IsColourRangeValueValid((uint64_t)in_RDI[1].b_), !bVar3)) {
    return false;
  }
  if ((in_RDI[1].white_point_ != (PrimaryChromaticity *)0xffffffffffffffff) &&
     (bVar3 = IsTransferCharacteristicsValueValid((uint64_t)in_RDI[1].white_point_), !bVar3)) {
    return false;
  }
  uVar2._0_4_ = in_RDI[2].luminance_max_;
  uVar2._4_4_ = in_RDI[2].luminance_min_;
  if ((uVar2 != 0xffffffffffffffff) &&
     (value_00._0_4_ = in_RDI[2].luminance_max_, value_00._4_4_ = in_RDI[2].luminance_min_,
     bVar3 = IsPrimariesValueValid(value_00), !bVar3)) {
    return false;
  }
  return true;
}

Assistant:

bool Colour::Valid() const {
  if (mastering_metadata_ && !mastering_metadata_->Valid())
    return false;
  if (matrix_coefficients_ != kValueNotPresent &&
      !IsMatrixCoefficientsValueValid(matrix_coefficients_)) {
    return false;
  }
  if (chroma_siting_horz_ != kValueNotPresent &&
      !IsChromaSitingHorzValueValid(chroma_siting_horz_)) {
    return false;
  }
  if (chroma_siting_vert_ != kValueNotPresent &&
      !IsChromaSitingVertValueValid(chroma_siting_vert_)) {
    return false;
  }
  if (range_ != kValueNotPresent && !IsColourRangeValueValid(range_))
    return false;
  if (transfer_characteristics_ != kValueNotPresent &&
      !IsTransferCharacteristicsValueValid(transfer_characteristics_)) {
    return false;
  }
  if (primaries_ != kValueNotPresent && !IsPrimariesValueValid(primaries_))
    return false;

  return true;
}